

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void str_utf8_stats(char *str,int max_size,int max_count,int *size,int *count)

{
  bool bVar1;
  int iVar2;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int *in_R8;
  int new_size;
  
  *in_RCX = 0;
  *in_R8 = 0;
  while( true ) {
    bVar1 = false;
    if (*in_RCX < in_ESI) {
      bVar1 = *in_R8 < in_EDX;
    }
    if (((!bVar1) || (iVar2 = str_utf8_forward(in_RDI,*in_RCX), iVar2 == *in_RCX)) ||
       (in_ESI <= iVar2)) break;
    *in_RCX = iVar2;
    *in_R8 = *in_R8 + 1;
  }
  return;
}

Assistant:

void str_utf8_stats(const char *str, int max_size, int max_count, int *size, int *count)
{
	*size = 0;
	*count = 0;
	while(*size < max_size && *count < max_count)
	{
		int new_size = str_utf8_forward(str, *size);
		if(new_size == *size || new_size >= max_size)
			break;
		*size = new_size;
		++(*count);
	}
}